

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorClassifier::SharedDtor(SupportVectorClassifier *this)

{
  bool bVar1;
  SupportVectorClassifier *pSVar2;
  SupportVectorClassifier *this_local;
  
  pSVar2 = internal_default_instance();
  if ((this != pSVar2) && (this->kernel_ != (Kernel *)0x0)) {
    (*(this->kernel_->super_MessageLite)._vptr_MessageLite[1])();
  }
  bVar1 = has_supportVectors(this);
  if (bVar1) {
    clear_supportVectors(this);
  }
  bVar1 = has_ClassLabels(this);
  if (bVar1) {
    clear_ClassLabels(this);
  }
  return;
}

Assistant:

void SupportVectorClassifier::SharedDtor() {
  if (this != internal_default_instance()) {
    delete kernel_;
  }
  if (has_supportVectors()) {
    clear_supportVectors();
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}